

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::ForeignMessageLite::ByteSizeLong(ForeignMessageLite *this)

{
  bool bVar1;
  int32_t value;
  int desired;
  uint32_t *puVar2;
  long lVar3;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  ForeignMessageLite *this_;
  ForeignMessageLite *this_local;
  
  sStack_20 = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar2 & 1) != 0) {
    value = _internal_c(this);
    sStack_20 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    sStack_20 = lVar3 + sStack_20;
  }
  desired = google::protobuf::internal::ToCachedSize(sStack_20);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return sStack_20;
}

Assistant:

::size_t ForeignMessageLite::ByteSizeLong() const {
  const ForeignMessageLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ForeignMessageLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 c = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_c());
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}